

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O0

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  void **in_RDX;
  void **in_RSI;
  long in_RDI;
  bool bVar2;
  int axis;
  int i;
  int *axes_ptr;
  bool _squeeze_c;
  bool _squeeze_d;
  bool _squeeze_h;
  bool _squeeze_w;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Allocator *in_stack_ffffffffffffe8b8;
  void **ppvVar3;
  int iVar4;
  undefined8 in_stack_ffffffffffffe8c0;
  int iVar5;
  Mat *in_stack_ffffffffffffe8c8;
  void **ppvVar6;
  Allocator *in_stack_ffffffffffffe930;
  undefined8 in_stack_ffffffffffffe938;
  int _c;
  undefined8 in_stack_ffffffffffffe940;
  Mat *in_stack_ffffffffffffe948;
  bool local_145c;
  bool local_145b;
  bool local_145a;
  bool local_1459;
  void *local_1440;
  int *local_1438;
  long *local_1420;
  void *local_13f8;
  int *local_13f0;
  long *local_13d8;
  void *local_13b0;
  int *local_13a8;
  long *local_1390;
  void *local_1368;
  int *local_1360;
  long *local_1348;
  void *local_1320;
  int *local_1318;
  long *local_1300;
  void *local_12d8;
  int *local_12d0;
  long *local_12b8;
  void *local_1290;
  int *local_1288;
  long *local_1270;
  void *local_1248;
  int *local_1240;
  long *local_1228;
  void *local_1200;
  int *local_11f8;
  long *local_11e0;
  void *local_11b8;
  int *local_11b0;
  long *local_1198;
  void *local_1170;
  int *local_1168;
  long *local_1150;
  void *local_1128;
  int *local_1120;
  long *local_1108;
  void *local_10e0;
  int *local_10d8;
  long *local_10c0;
  void *local_1098;
  int *local_1090;
  long *local_1078;
  void *local_1050;
  int *local_1048;
  long *local_1030;
  void *local_1008;
  int *local_1000;
  undefined8 local_ff8;
  undefined4 local_ff0;
  long *local_fe8;
  undefined4 local_fe0;
  undefined4 local_fdc;
  undefined4 local_fd8;
  undefined4 local_fd4;
  undefined4 local_fd0;
  undefined8 local_fc8;
  void *local_fc0;
  int *local_fb8;
  undefined8 local_fb0;
  undefined4 local_fa8;
  long *local_fa0;
  undefined4 local_f98;
  undefined4 local_f94;
  undefined4 local_f90;
  undefined4 local_f8c;
  undefined4 local_f88;
  undefined8 local_f80;
  void *local_f78;
  int *local_f70;
  undefined8 local_f68;
  undefined4 local_f60;
  long *local_f58;
  undefined4 local_f50;
  undefined4 local_f4c;
  undefined4 local_f48;
  undefined4 local_f44;
  undefined4 local_f40;
  undefined8 local_f38;
  void *local_f30;
  int *local_f28;
  undefined8 local_f20;
  undefined4 local_f18;
  long *local_f10;
  undefined4 local_f08;
  undefined4 local_f04;
  undefined4 local_f00;
  undefined4 local_efc;
  undefined4 local_ef8;
  undefined8 local_ef0;
  void *local_ee8;
  int *local_ee0;
  undefined8 local_ed8;
  undefined4 local_ed0;
  long *local_ec8;
  undefined4 local_ec0;
  undefined4 local_ebc;
  undefined4 local_eb8;
  undefined4 local_eb4;
  undefined4 local_eb0;
  undefined8 local_ea8;
  void *local_ea0;
  int *local_e98;
  undefined8 local_e90;
  undefined4 local_e88;
  long *local_e80;
  undefined4 local_e78;
  undefined4 local_e74;
  undefined4 local_e70;
  undefined4 local_e6c;
  undefined4 local_e68;
  undefined8 local_e60;
  void *local_e58;
  int *local_e50;
  undefined8 local_e48;
  undefined4 local_e40;
  long *local_e38;
  undefined4 local_e30;
  undefined4 local_e2c;
  undefined4 local_e28;
  undefined4 local_e24;
  undefined4 local_e20;
  undefined8 local_e18;
  void *local_e10;
  int *local_e08;
  undefined8 local_e00;
  undefined4 local_df8;
  long *local_df0;
  undefined4 local_de8;
  undefined4 local_de4;
  undefined4 local_de0;
  undefined4 local_ddc;
  undefined4 local_dd8;
  undefined8 local_dd0;
  void *local_dc8;
  int *local_dc0;
  undefined8 local_db8;
  undefined4 local_db0;
  long *local_da8;
  undefined4 local_da0;
  undefined4 local_d9c;
  undefined4 local_d98;
  undefined4 local_d94;
  undefined4 local_d90;
  undefined8 local_d88;
  void *local_d80;
  int *local_d78;
  undefined8 local_d70;
  undefined4 local_d68;
  long *local_d60;
  undefined4 local_d58;
  undefined4 local_d54;
  undefined4 local_d50;
  undefined4 local_d4c;
  undefined4 local_d48;
  undefined8 local_d40;
  void *local_d28;
  int *local_d20;
  undefined8 local_d18;
  undefined4 local_d10;
  long *local_d08;
  undefined4 local_d00;
  undefined4 local_cfc;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined4 local_cf0;
  undefined8 local_ce8;
  int local_ce0;
  int local_cdc;
  long local_cd8;
  bool local_cd0;
  bool local_ccf;
  bool local_cce;
  bool local_ccd;
  int local_ccc;
  int local_cc8;
  int local_cc4;
  int local_cc0;
  int local_cbc;
  void **local_cb0;
  int local_c94;
  int local_c90;
  undefined4 local_c8c;
  void **local_c88;
  void **local_c80;
  int local_c70;
  undefined4 local_c6c;
  void **local_c68;
  void **local_c60;
  int local_c50;
  undefined4 local_c4c;
  void **local_c48;
  void **local_c40;
  int local_c30;
  undefined4 local_c2c;
  void **local_c28;
  void **local_c20;
  int local_c10;
  undefined4 local_c0c;
  void **local_c08;
  void **local_c00;
  int local_bf0;
  undefined4 local_bec;
  void **local_be8;
  void **local_be0;
  int local_bd0;
  undefined4 local_bcc;
  void **local_bc8;
  void **local_bc0;
  int local_bb0;
  undefined4 local_bac;
  void **local_ba8;
  void **local_ba0;
  int local_b90;
  undefined4 local_b8c;
  void **local_b88;
  void **local_b80;
  int local_b70;
  undefined4 local_b6c;
  void **local_b68;
  void **local_b60;
  int local_b50;
  undefined4 local_b4c;
  void **local_b48;
  void **local_b40;
  int local_b30;
  undefined4 local_b2c;
  void **local_b28;
  void **local_b20;
  int local_b10;
  undefined4 local_b0c;
  void **local_b08;
  void **local_b00;
  int local_af0;
  undefined4 local_aec;
  void **local_ae8;
  void **local_ae0;
  int local_ad0;
  undefined4 local_acc;
  void **local_ac8;
  void **local_ac0;
  int local_ab0;
  undefined4 local_aac;
  void **local_aa8;
  void **local_aa0;
  int local_a90;
  undefined4 local_a8c;
  void **local_a88;
  void **local_a80;
  int local_a70;
  undefined4 local_a6c;
  void **local_a68;
  void **local_a60;
  int local_a50;
  undefined4 local_a4c;
  void **local_a48;
  void **local_a40;
  int local_a30;
  undefined4 local_a2c;
  void **local_a28;
  void **local_a20;
  int local_a10;
  undefined4 local_a0c;
  void **local_a08;
  void **local_a00;
  int local_9f0;
  undefined4 local_9ec;
  void **local_9e8;
  void **local_9e0;
  int local_9d0;
  undefined4 local_9cc;
  void **local_9c8;
  void **local_9c0;
  int local_9b0;
  undefined4 local_9ac;
  void **local_9a8;
  void **local_9a0;
  int local_990;
  undefined4 local_98c;
  void **local_988;
  void **local_980;
  int local_970;
  undefined4 local_96c;
  void **local_968;
  void **local_960;
  int local_950;
  undefined4 local_94c;
  void **local_948;
  void **local_930;
  void **local_920;
  void **local_910;
  void **local_900;
  void **local_8f0;
  void **local_8e0;
  void **local_8d0;
  void **local_8c0;
  void **local_8b0;
  void **local_8a0;
  void **local_890;
  void **local_880;
  void **local_870;
  void **local_860;
  void **local_850;
  void **local_840;
  void **local_830;
  void **local_820;
  void **local_810;
  void **local_800;
  void **local_7f0;
  void **local_7e0;
  void **local_7d0;
  void **local_7c0;
  void **local_7b0;
  void **local_7a0;
  long *local_788;
  long *local_780;
  int local_768;
  undefined4 local_764;
  void **local_760;
  int local_748;
  undefined4 local_744;
  void **local_740;
  int local_728;
  undefined4 local_724;
  void **local_720;
  int local_708;
  undefined4 local_704;
  void **local_700;
  int local_6e8;
  undefined4 local_6e4;
  void **local_6e0;
  int local_6c8;
  undefined4 local_6c4;
  void **local_6c0;
  int local_6a8;
  undefined4 local_6a4;
  void **local_6a0;
  int local_688;
  undefined4 local_684;
  void **local_680;
  int local_668;
  undefined4 local_664;
  void **local_660;
  int local_648;
  undefined4 local_644;
  void **local_640;
  int local_628;
  undefined4 local_624;
  void **local_620;
  int local_608;
  undefined4 local_604;
  void **local_600;
  int local_5e8;
  undefined4 local_5e4;
  void **local_5e0;
  int local_5c8;
  undefined4 local_5c4;
  void **local_5c0;
  int local_5a8;
  undefined4 local_5a4;
  void **local_5a0;
  int local_588;
  undefined4 local_584;
  void **local_580;
  int local_568;
  undefined4 local_564;
  void **local_560;
  int local_548;
  undefined4 local_544;
  void **local_540;
  int local_528;
  undefined4 local_524;
  void **local_520;
  int local_508;
  undefined4 local_504;
  void **local_500;
  int local_4e8;
  undefined4 local_4e4;
  void **local_4e0;
  int local_4c8;
  undefined4 local_4c4;
  void **local_4c0;
  int local_4a8;
  undefined4 local_4a4;
  void **local_4a0;
  int local_488;
  undefined4 local_484;
  void **local_480;
  int local_468;
  undefined4 local_464;
  void **local_460;
  int local_448;
  undefined4 local_444;
  void **local_440;
  int local_438;
  undefined4 local_434;
  int local_428;
  undefined4 local_424;
  void **local_420;
  int local_418;
  undefined4 local_414;
  void **local_410;
  int local_408;
  undefined4 local_404;
  void **local_400;
  int local_3f8;
  undefined4 local_3f4;
  void **local_3f0;
  int local_3e8;
  undefined4 local_3e4;
  void **local_3e0;
  int local_3d8;
  undefined4 local_3d4;
  void **local_3d0;
  int local_3c8;
  undefined4 local_3c4;
  void **local_3c0;
  int local_3b8;
  undefined4 local_3b4;
  void **local_3b0;
  int local_3a8;
  undefined4 local_3a4;
  void **local_3a0;
  int local_398;
  undefined4 local_394;
  void **local_390;
  int local_388;
  undefined4 local_384;
  void **local_380;
  int local_378;
  undefined4 local_374;
  void **local_370;
  int local_368;
  undefined4 local_364;
  void **local_360;
  int local_358;
  undefined4 local_354;
  void **local_350;
  int local_348;
  undefined4 local_344;
  void **local_340;
  int local_338;
  undefined4 local_334;
  void **local_330;
  int local_328;
  undefined4 local_324;
  void **local_320;
  int local_318;
  undefined4 local_314;
  void **local_310;
  int local_308;
  undefined4 local_304;
  void **local_300;
  int local_2f8;
  undefined4 local_2f4;
  void **local_2f0;
  int local_2e8;
  undefined4 local_2e4;
  void **local_2e0;
  int local_2d8;
  undefined4 local_2d4;
  void **local_2d0;
  int local_2c8;
  undefined4 local_2c4;
  void **local_2c0;
  int local_2b8;
  undefined4 local_2b4;
  void **local_2b0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  int local_298;
  undefined4 local_294;
  void **local_290;
  void *local_288;
  void *local_280;
  void *local_278;
  void *local_270;
  void *local_268;
  void *local_260;
  void *local_258;
  void *local_250;
  void *local_248;
  void *local_240;
  void *local_238;
  void *local_230;
  void *local_228;
  void *local_220;
  void *local_218;
  void *local_210;
  void *local_208;
  void *local_200;
  void *local_1f8;
  void *local_1f0;
  void *local_1e8;
  void *local_1e0;
  void *local_1d8;
  void *local_1d0;
  void *local_1c8;
  void *local_1c0;
  void *local_1b8;
  long *local_10;
  
  _c = (int)((ulong)in_stack_ffffffffffffe938 >> 0x20);
  local_cbc = *(int *)((long)in_RSI + 0x2c);
  local_cc0 = *(int *)(in_RSI + 6);
  local_cc4 = *(int *)((long)in_RSI + 0x34);
  local_cc8 = *(int *)(in_RSI + 7);
  local_ccc = *(int *)(in_RSI + 5);
  local_ccd = false;
  local_cce = false;
  local_ccf = false;
  local_cd0 = false;
  local_788 = (long *)(in_RDI + 0xe0);
  bVar2 = true;
  if (*local_788 != 0) {
    bVar2 = *(long *)(in_RDI + 0x120) * (long)*(int *)(in_RDI + 0x118) == 0;
    local_10 = local_788;
  }
  if (bVar2) {
    local_1459 = false;
    if (local_cbc == 1) {
      local_1459 = *(int *)(in_RDI + 0xd0) != 0;
    }
    local_ccd = local_1459;
    local_145a = false;
    if (local_cc0 == 1) {
      local_145a = *(int *)(in_RDI + 0xd4) != 0;
    }
    local_cce = local_145a;
    local_145b = false;
    if (local_cc4 == 1) {
      local_145b = *(int *)(in_RDI + 0xd8) != 0;
    }
    local_ccf = local_145b;
    local_145c = false;
    if (local_cc8 == 1) {
      local_145c = *(int *)(in_RDI + 0xdc) != 0;
    }
    local_cd0 = local_145c;
  }
  else {
    local_780 = (long *)(in_RDI + 0xe0);
    local_cd8 = *local_780;
    for (local_cdc = 0; local_cdc < *(int *)(in_RDI + 0x10c); local_cdc = local_cdc + 1) {
      local_ce0 = *(int *)(local_cd8 + (long)local_cdc * 4);
      if (local_ce0 < 0) {
        local_ce0 = local_ccc + local_ce0;
      }
      if ((local_ccc == 1) && (local_ce0 == 0)) {
        local_ccd = local_cbc == 1;
      }
      if ((local_ccc == 2) && (local_ce0 == 0)) {
        local_cce = local_cc0 == 1;
      }
      if ((local_ccc == 2) && (local_ce0 == 1)) {
        local_ccd = local_cbc == 1;
      }
      if ((local_ccc == 3) && (local_ce0 == 0)) {
        local_cd0 = local_cc8 == 1;
      }
      if ((local_ccc == 3) && (local_ce0 == 1)) {
        local_cce = local_cc0 == 1;
      }
      if ((local_ccc == 3) && (local_ce0 == 2)) {
        local_ccd = local_cbc == 1;
      }
      if ((local_ccc == 4) && (local_ce0 == 0)) {
        local_cd0 = local_cc8 == 1;
      }
      if ((local_ccc == 4) && (local_ce0 == 1)) {
        local_ccf = local_cc4 == 1;
      }
      if ((local_ccc == 4) && (local_ce0 == 2)) {
        local_cce = local_cc0 == 1;
      }
      if ((local_ccc == 4) && (local_ce0 == 3)) {
        local_ccd = local_cbc == 1;
      }
    }
  }
  local_cb0 = in_RDX;
  if (in_RDX != in_RSI) {
    if (in_RSI[1] != (void *)0x0) {
      piVar1 = (int *)in_RSI[1];
      local_94c = 1;
      LOCK();
      local_950 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_948 = in_RSI;
    if (in_RDX[1] != (void *)0x0) {
      piVar1 = (int *)in_RDX[1];
      local_434 = 0xffffffff;
      LOCK();
      local_438 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_438 == 1) {
        if (in_RDX[4] == (void *)0x0) {
          local_1b8 = *in_RDX;
          if (local_1b8 != (void *)0x0) {
            free(local_1b8);
          }
        }
        else {
          (**(code **)(*in_RDX[4] + 0x18))(in_RDX[4],*in_RDX);
        }
      }
    }
    *in_RDX = (void *)0x0;
    in_RDX[2] = (void *)0x0;
    *(undefined4 *)(in_RDX + 3) = 0;
    *(undefined4 *)(in_RDX + 5) = 0;
    *(undefined4 *)((long)in_RDX + 0x2c) = 0;
    *(undefined4 *)(in_RDX + 6) = 0;
    *(undefined4 *)((long)in_RDX + 0x34) = 0;
    *(undefined4 *)(in_RDX + 7) = 0;
    in_RDX[8] = (void *)0x0;
    in_RDX[1] = (void *)0x0;
    *in_RDX = *local_948;
    in_RDX[1] = local_948[1];
    in_RDX[2] = local_948[2];
    *(undefined4 *)(in_RDX + 3) = *(undefined4 *)(local_948 + 3);
    in_RDX[4] = local_948[4];
    *(undefined4 *)(in_RDX + 5) = *(undefined4 *)(local_948 + 5);
    *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_948 + 0x2c);
    *(undefined4 *)(in_RDX + 6) = *(undefined4 *)(local_948 + 6);
    *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_948 + 0x34);
    *(undefined4 *)(in_RDX + 7) = *(undefined4 *)(local_948 + 7);
    in_RDX[8] = local_948[8];
  }
  if ((local_ccc == 1) && ((local_ccd & 1U) != 0)) {
    Mat::reshape(in_stack_ffffffffffffe8c8,(int)((ulong)in_stack_ffffffffffffe8c0 >> 0x20),
                 in_stack_ffffffffffffe8b8);
    ppvVar3 = local_cb0;
    local_960 = local_cb0;
    local_968 = &local_d28;
    if (local_cb0 != local_968) {
      if (local_d20 != (int *)0x0) {
        local_96c = 1;
        LOCK();
        local_970 = *local_d20;
        *local_d20 = *local_d20 + 1;
        UNLOCK();
      }
      local_420 = local_cb0;
      if (local_cb0[1] != (void *)0x0) {
        piVar1 = (int *)local_cb0[1];
        local_424 = 0xffffffff;
        LOCK();
        local_428 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_428 == 1) {
          if (local_cb0[4] == (void *)0x0) {
            local_1c0 = *local_cb0;
            if (local_1c0 != (void *)0x0) {
              free(local_1c0);
            }
          }
          else {
            (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      ppvVar3[2] = (void *)0x0;
      *(undefined4 *)(ppvVar3 + 3) = 0;
      *(undefined4 *)(ppvVar3 + 5) = 0;
      *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
      *(undefined4 *)(ppvVar3 + 6) = 0;
      *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
      *(undefined4 *)(ppvVar3 + 7) = 0;
      ppvVar3[8] = (void *)0x0;
      ppvVar3[1] = (void *)0x0;
      *ppvVar3 = *local_968;
      ppvVar3[1] = local_968[1];
      ppvVar3[2] = local_968[2];
      *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_968 + 3);
      ppvVar3[4] = local_968[4];
      *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_968 + 5);
      *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_968 + 0x2c);
      *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_968 + 6);
      *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_968 + 0x34);
      *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_968 + 7);
      ppvVar3[8] = local_968[8];
    }
    local_930 = &local_d28;
    local_440 = local_930;
    if (local_d20 != (int *)0x0) {
      local_444 = 0xffffffff;
      LOCK();
      local_448 = *local_d20;
      *local_d20 = *local_d20 + -1;
      UNLOCK();
      if (local_448 == 1) {
        if (local_d08 == (long *)0x0) {
          if (local_d28 != (void *)0x0) {
            free(local_d28);
          }
        }
        else {
          (**(code **)(*local_d08 + 0x18))(local_d08,local_d28);
        }
      }
    }
    local_d28 = (void *)0x0;
    local_d18 = 0;
    local_d10 = 0;
    local_d00 = 0;
    local_cfc = 0;
    local_cf8 = 0;
    local_cf4 = 0;
    local_cf0 = 0;
    local_ce8 = 0;
    local_d20 = (int *)0x0;
  }
  if (local_ccc == 2) {
    iVar5 = (int)((ulong)in_stack_ffffffffffffe8c0 >> 0x20);
    if (((local_ccd & 1U) == 0) || ((local_cce & 1U) == 0)) {
      if ((local_ccd & 1U) == 0) {
        if ((local_cce & 1U) != 0) {
          Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,in_stack_ffffffffffffe8b8);
          ppvVar3 = local_cb0;
          local_9c0 = local_cb0;
          local_9c8 = &local_e10;
          if (local_cb0 != local_9c8) {
            if (local_e08 != (int *)0x0) {
              local_9cc = 1;
              LOCK();
              local_9d0 = *local_e08;
              *local_e08 = *local_e08 + 1;
              UNLOCK();
            }
            local_3f0 = local_cb0;
            if (local_cb0[1] != (void *)0x0) {
              piVar1 = (int *)local_cb0[1];
              local_3f4 = 0xffffffff;
              LOCK();
              local_3f8 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_3f8 == 1) {
                if (local_cb0[4] == (void *)0x0) {
                  local_1d8 = *local_cb0;
                  if (local_1d8 != (void *)0x0) {
                    free(local_1d8);
                  }
                }
                else {
                  (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            ppvVar3[2] = (void *)0x0;
            *(undefined4 *)(ppvVar3 + 3) = 0;
            *(undefined4 *)(ppvVar3 + 5) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
            *(undefined4 *)(ppvVar3 + 6) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
            *(undefined4 *)(ppvVar3 + 7) = 0;
            ppvVar3[8] = (void *)0x0;
            ppvVar3[1] = (void *)0x0;
            *ppvVar3 = *local_9c8;
            ppvVar3[1] = local_9c8[1];
            ppvVar3[2] = local_9c8[2];
            *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_9c8 + 3);
            ppvVar3[4] = local_9c8[4];
            *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_9c8 + 5);
            *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_9c8 + 0x2c);
            *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_9c8 + 6);
            *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_9c8 + 0x34);
            *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_9c8 + 7);
            ppvVar3[8] = local_9c8[8];
          }
          local_900 = &local_e10;
          local_4a0 = local_900;
          if (local_e08 != (int *)0x0) {
            local_4a4 = 0xffffffff;
            LOCK();
            local_4a8 = *local_e08;
            *local_e08 = *local_e08 + -1;
            UNLOCK();
            if (local_4a8 == 1) {
              if (local_df0 == (long *)0x0) {
                if (local_e10 != (void *)0x0) {
                  free(local_e10);
                }
              }
              else {
                (**(code **)(*local_df0 + 0x18))(local_df0,local_e10);
              }
            }
          }
          local_e10 = (void *)0x0;
          local_e00 = 0;
          local_df8 = 0;
          local_de8 = 0;
          local_de4 = 0;
          local_de0 = 0;
          local_ddc = 0;
          local_dd8 = 0;
          local_dd0 = 0;
          local_e08 = (int *)0x0;
        }
      }
      else {
        Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,in_stack_ffffffffffffe8b8);
        ppvVar3 = local_cb0;
        local_9a0 = local_cb0;
        local_9a8 = &local_dc8;
        if (local_cb0 != local_9a8) {
          if (local_dc0 != (int *)0x0) {
            local_9ac = 1;
            LOCK();
            local_9b0 = *local_dc0;
            *local_dc0 = *local_dc0 + 1;
            UNLOCK();
          }
          local_400 = local_cb0;
          if (local_cb0[1] != (void *)0x0) {
            piVar1 = (int *)local_cb0[1];
            local_404 = 0xffffffff;
            LOCK();
            local_408 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_408 == 1) {
              if (local_cb0[4] == (void *)0x0) {
                local_1d0 = *local_cb0;
                if (local_1d0 != (void *)0x0) {
                  free(local_1d0);
                }
              }
              else {
                (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          ppvVar3[2] = (void *)0x0;
          *(undefined4 *)(ppvVar3 + 3) = 0;
          *(undefined4 *)(ppvVar3 + 5) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
          *(undefined4 *)(ppvVar3 + 6) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
          *(undefined4 *)(ppvVar3 + 7) = 0;
          ppvVar3[8] = (void *)0x0;
          ppvVar3[1] = (void *)0x0;
          *ppvVar3 = *local_9a8;
          ppvVar3[1] = local_9a8[1];
          ppvVar3[2] = local_9a8[2];
          *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_9a8 + 3);
          ppvVar3[4] = local_9a8[4];
          *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_9a8 + 5);
          *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_9a8 + 0x2c);
          *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_9a8 + 6);
          *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_9a8 + 0x34);
          *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_9a8 + 7);
          ppvVar3[8] = local_9a8[8];
        }
        local_910 = &local_dc8;
        local_480 = local_910;
        if (local_dc0 != (int *)0x0) {
          local_484 = 0xffffffff;
          LOCK();
          local_488 = *local_dc0;
          *local_dc0 = *local_dc0 + -1;
          UNLOCK();
          if (local_488 == 1) {
            if (local_da8 == (long *)0x0) {
              if (local_dc8 != (void *)0x0) {
                free(local_dc8);
              }
            }
            else {
              (**(code **)(*local_da8 + 0x18))(local_da8,local_dc8);
            }
          }
        }
        local_dc8 = (void *)0x0;
        local_db8 = 0;
        local_db0 = 0;
        local_da0 = 0;
        local_d9c = 0;
        local_d98 = 0;
        local_d94 = 0;
        local_d90 = 0;
        local_d88 = 0;
        local_dc0 = (int *)0x0;
      }
    }
    else {
      Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,in_stack_ffffffffffffe8b8);
      ppvVar3 = local_cb0;
      local_980 = local_cb0;
      local_988 = &local_d80;
      if (local_cb0 != local_988) {
        if (local_d78 != (int *)0x0) {
          local_98c = 1;
          LOCK();
          local_990 = *local_d78;
          *local_d78 = *local_d78 + 1;
          UNLOCK();
        }
        local_410 = local_cb0;
        if (local_cb0[1] != (void *)0x0) {
          piVar1 = (int *)local_cb0[1];
          local_414 = 0xffffffff;
          LOCK();
          local_418 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_418 == 1) {
            if (local_cb0[4] == (void *)0x0) {
              local_1c8 = *local_cb0;
              if (local_1c8 != (void *)0x0) {
                free(local_1c8);
              }
            }
            else {
              (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        ppvVar3[2] = (void *)0x0;
        *(undefined4 *)(ppvVar3 + 3) = 0;
        *(undefined4 *)(ppvVar3 + 5) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
        *(undefined4 *)(ppvVar3 + 6) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
        *(undefined4 *)(ppvVar3 + 7) = 0;
        ppvVar3[8] = (void *)0x0;
        ppvVar3[1] = (void *)0x0;
        *ppvVar3 = *local_988;
        ppvVar3[1] = local_988[1];
        ppvVar3[2] = local_988[2];
        *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_988 + 3);
        ppvVar3[4] = local_988[4];
        *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_988 + 5);
        *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_988 + 0x2c);
        *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_988 + 6);
        *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_988 + 0x34);
        *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_988 + 7);
        ppvVar3[8] = local_988[8];
      }
      local_920 = &local_d80;
      local_460 = local_920;
      if (local_d78 != (int *)0x0) {
        local_464 = 0xffffffff;
        LOCK();
        local_468 = *local_d78;
        *local_d78 = *local_d78 + -1;
        UNLOCK();
        if (local_468 == 1) {
          if (local_d60 == (long *)0x0) {
            if (local_d80 != (void *)0x0) {
              free(local_d80);
            }
          }
          else {
            (**(code **)(*local_d60 + 0x18))(local_d60,local_d80);
          }
        }
      }
      local_d80 = (void *)0x0;
      local_d70 = 0;
      local_d68 = 0;
      local_d58 = 0;
      local_d54 = 0;
      local_d50 = 0;
      local_d4c = 0;
      local_d48 = 0;
      local_d40 = 0;
      local_d78 = (int *)0x0;
    }
  }
  if (local_ccc == 3) {
    iVar5 = (int)((ulong)in_stack_ffffffffffffe8c0 >> 0x20);
    if ((((local_ccd & 1U) == 0) || ((local_cce & 1U) == 0)) || ((local_cd0 & 1U) == 0)) {
      if (((local_ccd & 1U) == 0) || ((local_cce & 1U) == 0)) {
        if (((local_cce & 1U) == 0) || ((local_cd0 & 1U) == 0)) {
          if (((local_ccd & 1U) == 0) || ((local_cd0 & 1U) == 0)) {
            iVar4 = (int)in_stack_ffffffffffffe8c0;
            if ((local_ccd & 1U) == 0) {
              if ((local_cce & 1U) == 0) {
                if ((local_cd0 & 1U) != 0) {
                  Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,iVar4,in_stack_ffffffffffffe8b8);
                  ppvVar3 = local_cb0;
                  local_aa0 = local_cb0;
                  local_aa8 = &local_1008;
                  if (local_cb0 != local_aa8) {
                    if (local_1000 != (int *)0x0) {
                      local_aac = 1;
                      LOCK();
                      local_ab0 = *local_1000;
                      *local_1000 = *local_1000 + 1;
                      UNLOCK();
                    }
                    local_380 = local_cb0;
                    if (local_cb0[1] != (void *)0x0) {
                      piVar1 = (int *)local_cb0[1];
                      local_384 = 0xffffffff;
                      LOCK();
                      local_388 = *piVar1;
                      *piVar1 = *piVar1 + -1;
                      UNLOCK();
                      if (local_388 == 1) {
                        if (local_cb0[4] == (void *)0x0) {
                          local_210 = *local_cb0;
                          if (local_210 != (void *)0x0) {
                            free(local_210);
                          }
                        }
                        else {
                          (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                        }
                      }
                    }
                    *ppvVar3 = (void *)0x0;
                    ppvVar3[2] = (void *)0x0;
                    *(undefined4 *)(ppvVar3 + 3) = 0;
                    *(undefined4 *)(ppvVar3 + 5) = 0;
                    *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                    *(undefined4 *)(ppvVar3 + 6) = 0;
                    *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                    *(undefined4 *)(ppvVar3 + 7) = 0;
                    ppvVar3[8] = (void *)0x0;
                    ppvVar3[1] = (void *)0x0;
                    *ppvVar3 = *local_aa8;
                    ppvVar3[1] = local_aa8[1];
                    ppvVar3[2] = local_aa8[2];
                    *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_aa8 + 3);
                    ppvVar3[4] = local_aa8[4];
                    *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_aa8 + 5);
                    *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_aa8 + 0x2c);
                    *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_aa8 + 6);
                    *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_aa8 + 0x34);
                    *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_aa8 + 7);
                    ppvVar3[8] = local_aa8[8];
                  }
                  local_890 = &local_1008;
                  local_580 = local_890;
                  if (local_1000 != (int *)0x0) {
                    local_584 = 0xffffffff;
                    LOCK();
                    local_588 = *local_1000;
                    *local_1000 = *local_1000 + -1;
                    UNLOCK();
                    if (local_588 == 1) {
                      if (local_fe8 == (long *)0x0) {
                        if (local_1008 != (void *)0x0) {
                          free(local_1008);
                        }
                      }
                      else {
                        (**(code **)(*local_fe8 + 0x18))(local_fe8,local_1008);
                      }
                    }
                  }
                  local_1008 = (void *)0x0;
                  local_ff8 = 0;
                  local_ff0 = 0;
                  local_fe0 = 0;
                  local_fdc = 0;
                  local_fd8 = 0;
                  local_fd4 = 0;
                  local_fd0 = 0;
                  local_fc8 = 0;
                  local_1000 = (int *)0x0;
                }
              }
              else {
                Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,iVar4,in_stack_ffffffffffffe8b8);
                ppvVar3 = local_cb0;
                local_a80 = local_cb0;
                local_a88 = &local_fc0;
                if (local_cb0 != local_a88) {
                  if (local_fb8 != (int *)0x0) {
                    local_a8c = 1;
                    LOCK();
                    local_a90 = *local_fb8;
                    *local_fb8 = *local_fb8 + 1;
                    UNLOCK();
                  }
                  local_390 = local_cb0;
                  if (local_cb0[1] != (void *)0x0) {
                    piVar1 = (int *)local_cb0[1];
                    local_394 = 0xffffffff;
                    LOCK();
                    local_398 = *piVar1;
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (local_398 == 1) {
                      if (local_cb0[4] == (void *)0x0) {
                        local_208 = *local_cb0;
                        if (local_208 != (void *)0x0) {
                          free(local_208);
                        }
                      }
                      else {
                        (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                      }
                    }
                  }
                  *ppvVar3 = (void *)0x0;
                  ppvVar3[2] = (void *)0x0;
                  *(undefined4 *)(ppvVar3 + 3) = 0;
                  *(undefined4 *)(ppvVar3 + 5) = 0;
                  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                  *(undefined4 *)(ppvVar3 + 6) = 0;
                  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                  *(undefined4 *)(ppvVar3 + 7) = 0;
                  ppvVar3[8] = (void *)0x0;
                  ppvVar3[1] = (void *)0x0;
                  *ppvVar3 = *local_a88;
                  ppvVar3[1] = local_a88[1];
                  ppvVar3[2] = local_a88[2];
                  *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_a88 + 3);
                  ppvVar3[4] = local_a88[4];
                  *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_a88 + 5);
                  *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_a88 + 0x2c);
                  *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_a88 + 6);
                  *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_a88 + 0x34);
                  *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_a88 + 7);
                  ppvVar3[8] = local_a88[8];
                }
                local_8a0 = &local_fc0;
                local_560 = local_8a0;
                if (local_fb8 != (int *)0x0) {
                  local_564 = 0xffffffff;
                  LOCK();
                  local_568 = *local_fb8;
                  *local_fb8 = *local_fb8 + -1;
                  UNLOCK();
                  if (local_568 == 1) {
                    if (local_fa0 == (long *)0x0) {
                      if (local_fc0 != (void *)0x0) {
                        free(local_fc0);
                      }
                    }
                    else {
                      (**(code **)(*local_fa0 + 0x18))(local_fa0,local_fc0);
                    }
                  }
                }
                local_fc0 = (void *)0x0;
                local_fb0 = 0;
                local_fa8 = 0;
                local_f98 = 0;
                local_f94 = 0;
                local_f90 = 0;
                local_f8c = 0;
                local_f88 = 0;
                local_f80 = 0;
                local_fb8 = (int *)0x0;
              }
            }
            else {
              Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,iVar4,in_stack_ffffffffffffe8b8);
              ppvVar3 = local_cb0;
              local_a60 = local_cb0;
              local_a68 = &local_f78;
              if (local_cb0 != local_a68) {
                if (local_f70 != (int *)0x0) {
                  local_a6c = 1;
                  LOCK();
                  local_a70 = *local_f70;
                  *local_f70 = *local_f70 + 1;
                  UNLOCK();
                }
                local_3a0 = local_cb0;
                if (local_cb0[1] != (void *)0x0) {
                  piVar1 = (int *)local_cb0[1];
                  local_3a4 = 0xffffffff;
                  LOCK();
                  local_3a8 = *piVar1;
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (local_3a8 == 1) {
                    if (local_cb0[4] == (void *)0x0) {
                      local_200 = *local_cb0;
                      if (local_200 != (void *)0x0) {
                        free(local_200);
                      }
                    }
                    else {
                      (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                    }
                  }
                }
                *ppvVar3 = (void *)0x0;
                ppvVar3[2] = (void *)0x0;
                *(undefined4 *)(ppvVar3 + 3) = 0;
                *(undefined4 *)(ppvVar3 + 5) = 0;
                *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                *(undefined4 *)(ppvVar3 + 6) = 0;
                *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                *(undefined4 *)(ppvVar3 + 7) = 0;
                ppvVar3[8] = (void *)0x0;
                ppvVar3[1] = (void *)0x0;
                *ppvVar3 = *local_a68;
                ppvVar3[1] = local_a68[1];
                ppvVar3[2] = local_a68[2];
                *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_a68 + 3);
                ppvVar3[4] = local_a68[4];
                *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_a68 + 5);
                *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_a68 + 0x2c);
                *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_a68 + 6);
                *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_a68 + 0x34);
                *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_a68 + 7);
                ppvVar3[8] = local_a68[8];
              }
              local_8b0 = &local_f78;
              local_540 = local_8b0;
              if (local_f70 != (int *)0x0) {
                local_544 = 0xffffffff;
                LOCK();
                local_548 = *local_f70;
                *local_f70 = *local_f70 + -1;
                UNLOCK();
                if (local_548 == 1) {
                  if (local_f58 == (long *)0x0) {
                    if (local_f78 != (void *)0x0) {
                      free(local_f78);
                    }
                  }
                  else {
                    (**(code **)(*local_f58 + 0x18))(local_f58,local_f78);
                  }
                }
              }
              local_f78 = (void *)0x0;
              local_f68 = 0;
              local_f60 = 0;
              local_f50 = 0;
              local_f4c = 0;
              local_f48 = 0;
              local_f44 = 0;
              local_f40 = 0;
              local_f38 = 0;
              local_f70 = (int *)0x0;
            }
          }
          else {
            Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,in_stack_ffffffffffffe8b8);
            ppvVar3 = local_cb0;
            local_a40 = local_cb0;
            local_a48 = &local_f30;
            if (local_cb0 != local_a48) {
              if (local_f28 != (int *)0x0) {
                local_a4c = 1;
                LOCK();
                local_a50 = *local_f28;
                *local_f28 = *local_f28 + 1;
                UNLOCK();
              }
              local_3b0 = local_cb0;
              if (local_cb0[1] != (void *)0x0) {
                piVar1 = (int *)local_cb0[1];
                local_3b4 = 0xffffffff;
                LOCK();
                local_3b8 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (local_3b8 == 1) {
                  if (local_cb0[4] == (void *)0x0) {
                    local_1f8 = *local_cb0;
                    if (local_1f8 != (void *)0x0) {
                      free(local_1f8);
                    }
                  }
                  else {
                    (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                  }
                }
              }
              *ppvVar3 = (void *)0x0;
              ppvVar3[2] = (void *)0x0;
              *(undefined4 *)(ppvVar3 + 3) = 0;
              *(undefined4 *)(ppvVar3 + 5) = 0;
              *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
              *(undefined4 *)(ppvVar3 + 6) = 0;
              *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
              *(undefined4 *)(ppvVar3 + 7) = 0;
              ppvVar3[8] = (void *)0x0;
              ppvVar3[1] = (void *)0x0;
              *ppvVar3 = *local_a48;
              ppvVar3[1] = local_a48[1];
              ppvVar3[2] = local_a48[2];
              *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_a48 + 3);
              ppvVar3[4] = local_a48[4];
              *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_a48 + 5);
              *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_a48 + 0x2c);
              *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_a48 + 6);
              *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_a48 + 0x34);
              *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_a48 + 7);
              ppvVar3[8] = local_a48[8];
            }
            local_8c0 = &local_f30;
            local_520 = local_8c0;
            if (local_f28 != (int *)0x0) {
              local_524 = 0xffffffff;
              LOCK();
              local_528 = *local_f28;
              *local_f28 = *local_f28 + -1;
              UNLOCK();
              if (local_528 == 1) {
                if (local_f10 == (long *)0x0) {
                  if (local_f30 != (void *)0x0) {
                    free(local_f30);
                  }
                }
                else {
                  (**(code **)(*local_f10 + 0x18))(local_f10,local_f30);
                }
              }
            }
            local_f30 = (void *)0x0;
            local_f20 = 0;
            local_f18 = 0;
            local_f08 = 0;
            local_f04 = 0;
            local_f00 = 0;
            local_efc = 0;
            local_ef8 = 0;
            local_ef0 = 0;
            local_f28 = (int *)0x0;
          }
        }
        else {
          Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,in_stack_ffffffffffffe8b8);
          ppvVar3 = local_cb0;
          local_a20 = local_cb0;
          local_a28 = &local_ee8;
          if (local_cb0 != local_a28) {
            if (local_ee0 != (int *)0x0) {
              local_a2c = 1;
              LOCK();
              local_a30 = *local_ee0;
              *local_ee0 = *local_ee0 + 1;
              UNLOCK();
            }
            local_3c0 = local_cb0;
            if (local_cb0[1] != (void *)0x0) {
              piVar1 = (int *)local_cb0[1];
              local_3c4 = 0xffffffff;
              LOCK();
              local_3c8 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_3c8 == 1) {
                if (local_cb0[4] == (void *)0x0) {
                  local_1f0 = *local_cb0;
                  if (local_1f0 != (void *)0x0) {
                    free(local_1f0);
                  }
                }
                else {
                  (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            ppvVar3[2] = (void *)0x0;
            *(undefined4 *)(ppvVar3 + 3) = 0;
            *(undefined4 *)(ppvVar3 + 5) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
            *(undefined4 *)(ppvVar3 + 6) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
            *(undefined4 *)(ppvVar3 + 7) = 0;
            ppvVar3[8] = (void *)0x0;
            ppvVar3[1] = (void *)0x0;
            *ppvVar3 = *local_a28;
            ppvVar3[1] = local_a28[1];
            ppvVar3[2] = local_a28[2];
            *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_a28 + 3);
            ppvVar3[4] = local_a28[4];
            *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_a28 + 5);
            *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_a28 + 0x2c);
            *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_a28 + 6);
            *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_a28 + 0x34);
            *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_a28 + 7);
            ppvVar3[8] = local_a28[8];
          }
          local_8d0 = &local_ee8;
          local_500 = local_8d0;
          if (local_ee0 != (int *)0x0) {
            local_504 = 0xffffffff;
            LOCK();
            local_508 = *local_ee0;
            *local_ee0 = *local_ee0 + -1;
            UNLOCK();
            if (local_508 == 1) {
              if (local_ec8 == (long *)0x0) {
                if (local_ee8 != (void *)0x0) {
                  free(local_ee8);
                }
              }
              else {
                (**(code **)(*local_ec8 + 0x18))(local_ec8,local_ee8);
              }
            }
          }
          local_ee8 = (void *)0x0;
          local_ed8 = 0;
          local_ed0 = 0;
          local_ec0 = 0;
          local_ebc = 0;
          local_eb8 = 0;
          local_eb4 = 0;
          local_eb0 = 0;
          local_ea8 = 0;
          local_ee0 = (int *)0x0;
        }
      }
      else {
        Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,in_stack_ffffffffffffe8b8);
        ppvVar3 = local_cb0;
        local_a00 = local_cb0;
        local_a08 = &local_ea0;
        if (local_cb0 != local_a08) {
          if (local_e98 != (int *)0x0) {
            local_a0c = 1;
            LOCK();
            local_a10 = *local_e98;
            *local_e98 = *local_e98 + 1;
            UNLOCK();
          }
          local_3d0 = local_cb0;
          if (local_cb0[1] != (void *)0x0) {
            piVar1 = (int *)local_cb0[1];
            local_3d4 = 0xffffffff;
            LOCK();
            local_3d8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_3d8 == 1) {
              if (local_cb0[4] == (void *)0x0) {
                local_1e8 = *local_cb0;
                if (local_1e8 != (void *)0x0) {
                  free(local_1e8);
                }
              }
              else {
                (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          ppvVar3[2] = (void *)0x0;
          *(undefined4 *)(ppvVar3 + 3) = 0;
          *(undefined4 *)(ppvVar3 + 5) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
          *(undefined4 *)(ppvVar3 + 6) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
          *(undefined4 *)(ppvVar3 + 7) = 0;
          ppvVar3[8] = (void *)0x0;
          ppvVar3[1] = (void *)0x0;
          *ppvVar3 = *local_a08;
          ppvVar3[1] = local_a08[1];
          ppvVar3[2] = local_a08[2];
          *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_a08 + 3);
          ppvVar3[4] = local_a08[4];
          *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_a08 + 5);
          *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_a08 + 0x2c);
          *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_a08 + 6);
          *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_a08 + 0x34);
          *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_a08 + 7);
          ppvVar3[8] = local_a08[8];
        }
        local_8e0 = &local_ea0;
        local_4e0 = local_8e0;
        if (local_e98 != (int *)0x0) {
          local_4e4 = 0xffffffff;
          LOCK();
          local_4e8 = *local_e98;
          *local_e98 = *local_e98 + -1;
          UNLOCK();
          if (local_4e8 == 1) {
            if (local_e80 == (long *)0x0) {
              if (local_ea0 != (void *)0x0) {
                free(local_ea0);
              }
            }
            else {
              (**(code **)(*local_e80 + 0x18))(local_e80,local_ea0);
            }
          }
        }
        local_ea0 = (void *)0x0;
        local_e90 = 0;
        local_e88 = 0;
        local_e78 = 0;
        local_e74 = 0;
        local_e70 = 0;
        local_e6c = 0;
        local_e68 = 0;
        local_e60 = 0;
        local_e98 = (int *)0x0;
      }
    }
    else {
      Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,in_stack_ffffffffffffe8b8);
      ppvVar3 = local_cb0;
      local_9e0 = local_cb0;
      local_9e8 = &local_e58;
      if (local_cb0 != local_9e8) {
        if (local_e50 != (int *)0x0) {
          local_9ec = 1;
          LOCK();
          local_9f0 = *local_e50;
          *local_e50 = *local_e50 + 1;
          UNLOCK();
        }
        local_3e0 = local_cb0;
        if (local_cb0[1] != (void *)0x0) {
          piVar1 = (int *)local_cb0[1];
          local_3e4 = 0xffffffff;
          LOCK();
          local_3e8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_3e8 == 1) {
            if (local_cb0[4] == (void *)0x0) {
              local_1e0 = *local_cb0;
              if (local_1e0 != (void *)0x0) {
                free(local_1e0);
              }
            }
            else {
              (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        ppvVar3[2] = (void *)0x0;
        *(undefined4 *)(ppvVar3 + 3) = 0;
        *(undefined4 *)(ppvVar3 + 5) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
        *(undefined4 *)(ppvVar3 + 6) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
        *(undefined4 *)(ppvVar3 + 7) = 0;
        ppvVar3[8] = (void *)0x0;
        ppvVar3[1] = (void *)0x0;
        *ppvVar3 = *local_9e8;
        ppvVar3[1] = local_9e8[1];
        ppvVar3[2] = local_9e8[2];
        *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_9e8 + 3);
        ppvVar3[4] = local_9e8[4];
        *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_9e8 + 5);
        *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_9e8 + 0x2c);
        *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_9e8 + 6);
        *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_9e8 + 0x34);
        *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_9e8 + 7);
        ppvVar3[8] = local_9e8[8];
      }
      local_8f0 = &local_e58;
      local_4c0 = local_8f0;
      if (local_e50 != (int *)0x0) {
        local_4c4 = 0xffffffff;
        LOCK();
        local_4c8 = *local_e50;
        *local_e50 = *local_e50 + -1;
        UNLOCK();
        if (local_4c8 == 1) {
          if (local_e38 == (long *)0x0) {
            if (local_e58 != (void *)0x0) {
              free(local_e58);
            }
          }
          else {
            (**(code **)(*local_e38 + 0x18))(local_e38,local_e58);
          }
        }
      }
      local_e58 = (void *)0x0;
      local_e48 = 0;
      local_e40 = 0;
      local_e30 = 0;
      local_e2c = 0;
      local_e28 = 0;
      local_e24 = 0;
      local_e20 = 0;
      local_e18 = 0;
      local_e50 = (int *)0x0;
    }
  }
  if (local_ccc == 4) {
    iVar5 = (int)((ulong)in_stack_ffffffffffffe8c0 >> 0x20);
    if (((((local_ccd & 1U) == 0) || ((local_cce & 1U) == 0)) || ((local_ccf & 1U) == 0)) ||
       ((local_cd0 & 1U) == 0)) {
      if ((((local_ccd & 1U) == 0) || ((local_cce & 1U) == 0)) || ((local_ccf & 1U) == 0)) {
        if ((((local_cce & 1U) == 0) || ((local_ccf & 1U) == 0)) || ((local_cd0 & 1U) == 0)) {
          if ((((local_ccd & 1U) == 0) || ((local_ccf & 1U) == 0)) || ((local_cd0 & 1U) == 0)) {
            if ((((local_ccd & 1U) == 0) || ((local_cce & 1U) == 0)) || ((local_cd0 & 1U) == 0)) {
              iVar4 = (int)in_stack_ffffffffffffe8c0;
              if (((local_ccd & 1U) == 0) || ((local_cce & 1U) == 0)) {
                if (((local_ccd & 1U) == 0) || ((local_ccf & 1U) == 0)) {
                  if (((local_cce & 1U) == 0) || ((local_ccf & 1U) == 0)) {
                    if (((local_cce & 1U) == 0) || ((local_cd0 & 1U) == 0)) {
                      if (((local_ccd & 1U) == 0) || ((local_cd0 & 1U) == 0)) {
                        if (((local_ccf & 1U) == 0) || ((local_cd0 & 1U) == 0)) {
                          iVar5 = (int)in_stack_ffffffffffffe940;
                          iVar4 = (int)((ulong)in_stack_ffffffffffffe940 >> 0x20);
                          if ((local_ccd & 1U) == 0) {
                            if ((local_cce & 1U) == 0) {
                              if ((local_ccf & 1U) == 0) {
                                if ((local_cd0 & 1U) != 0) {
                                  Mat::reshape(in_stack_ffffffffffffe948,iVar4,iVar5,_c,
                                               in_stack_ffffffffffffe930);
                                  ppvVar3 = local_cb0;
                                  local_c80 = local_cb0;
                                  local_c88 = &local_1440;
                                  if (local_cb0 != local_c88) {
                                    if (local_1438 != (int *)0x0) {
                                      local_c8c = 1;
                                      LOCK();
                                      local_c90 = *local_1438;
                                      *local_1438 = *local_1438 + 1;
                                      UNLOCK();
                                    }
                                    local_290 = local_cb0;
                                    if (local_cb0[1] != (void *)0x0) {
                                      piVar1 = (int *)local_cb0[1];
                                      local_294 = 0xffffffff;
                                      LOCK();
                                      local_298 = *piVar1;
                                      *piVar1 = *piVar1 + -1;
                                      UNLOCK();
                                      if (local_298 == 1) {
                                        if (local_cb0[4] == (void *)0x0) {
                                          local_288 = *local_cb0;
                                          if (local_288 != (void *)0x0) {
                                            free(local_288);
                                          }
                                        }
                                        else {
                                          (**(code **)(*local_cb0[4] + 0x18))
                                                    (local_cb0[4],*local_cb0);
                                        }
                                      }
                                    }
                                    *ppvVar3 = (void *)0x0;
                                    ppvVar3[2] = (void *)0x0;
                                    *(undefined4 *)(ppvVar3 + 3) = 0;
                                    *(undefined4 *)(ppvVar3 + 5) = 0;
                                    *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                                    *(undefined4 *)(ppvVar3 + 6) = 0;
                                    *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                                    *(undefined4 *)(ppvVar3 + 7) = 0;
                                    ppvVar3[8] = (void *)0x0;
                                    ppvVar3[1] = (void *)0x0;
                                    *ppvVar3 = *local_c88;
                                    ppvVar3[1] = local_c88[1];
                                    ppvVar3[2] = local_c88[2];
                                    *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_c88 + 3);
                                    ppvVar3[4] = local_c88[4];
                                    *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_c88 + 5);
                                    *(undefined4 *)((long)ppvVar3 + 0x2c) =
                                         *(undefined4 *)((long)local_c88 + 0x2c);
                                    *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_c88 + 6);
                                    *(undefined4 *)((long)ppvVar3 + 0x34) =
                                         *(undefined4 *)((long)local_c88 + 0x34);
                                    *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_c88 + 7);
                                    ppvVar3[8] = local_c88[8];
                                  }
                                  local_7a0 = &local_1440;
                                  if (local_1438 != (int *)0x0) {
                                    local_764 = 0xffffffff;
                                    LOCK();
                                    local_768 = *local_1438;
                                    *local_1438 = *local_1438 + -1;
                                    UNLOCK();
                                    if (local_768 == 1) {
                                      local_760 = local_7a0;
                                      if (local_1420 == (long *)0x0) {
                                        if (local_1440 != (void *)0x0) {
                                          free(local_1440);
                                        }
                                      }
                                      else {
                                        (**(code **)(*local_1420 + 0x18))(local_1420,local_1440);
                                      }
                                    }
                                  }
                                }
                              }
                              else {
                                Mat::reshape(in_stack_ffffffffffffe948,iVar4,iVar5,_c,
                                             in_stack_ffffffffffffe930);
                                ppvVar3 = local_cb0;
                                local_c60 = local_cb0;
                                local_c68 = &local_13f8;
                                if (local_cb0 != local_c68) {
                                  if (local_13f0 != (int *)0x0) {
                                    local_c6c = 1;
                                    LOCK();
                                    local_c70 = *local_13f0;
                                    *local_13f0 = *local_13f0 + 1;
                                    UNLOCK();
                                  }
                                  local_2a0 = local_cb0;
                                  if (local_cb0[1] != (void *)0x0) {
                                    piVar1 = (int *)local_cb0[1];
                                    local_2a4 = 0xffffffff;
                                    LOCK();
                                    local_2a8 = *piVar1;
                                    *piVar1 = *piVar1 + -1;
                                    UNLOCK();
                                    if (local_2a8 == 1) {
                                      if (local_cb0[4] == (void *)0x0) {
                                        local_280 = *local_cb0;
                                        if (local_280 != (void *)0x0) {
                                          free(local_280);
                                        }
                                      }
                                      else {
                                        (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0)
                                        ;
                                      }
                                    }
                                  }
                                  *ppvVar3 = (void *)0x0;
                                  ppvVar3[2] = (void *)0x0;
                                  *(undefined4 *)(ppvVar3 + 3) = 0;
                                  *(undefined4 *)(ppvVar3 + 5) = 0;
                                  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                                  *(undefined4 *)(ppvVar3 + 6) = 0;
                                  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                                  *(undefined4 *)(ppvVar3 + 7) = 0;
                                  ppvVar3[8] = (void *)0x0;
                                  ppvVar3[1] = (void *)0x0;
                                  *ppvVar3 = *local_c68;
                                  ppvVar3[1] = local_c68[1];
                                  ppvVar3[2] = local_c68[2];
                                  *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_c68 + 3);
                                  ppvVar3[4] = local_c68[4];
                                  *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_c68 + 5);
                                  *(undefined4 *)((long)ppvVar3 + 0x2c) =
                                       *(undefined4 *)((long)local_c68 + 0x2c);
                                  *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_c68 + 6);
                                  *(undefined4 *)((long)ppvVar3 + 0x34) =
                                       *(undefined4 *)((long)local_c68 + 0x34);
                                  *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_c68 + 7);
                                  ppvVar3[8] = local_c68[8];
                                }
                                local_7b0 = &local_13f8;
                                if (local_13f0 != (int *)0x0) {
                                  local_744 = 0xffffffff;
                                  LOCK();
                                  local_748 = *local_13f0;
                                  *local_13f0 = *local_13f0 + -1;
                                  UNLOCK();
                                  if (local_748 == 1) {
                                    local_740 = local_7b0;
                                    if (local_13d8 == (long *)0x0) {
                                      if (local_13f8 != (void *)0x0) {
                                        free(local_13f8);
                                      }
                                    }
                                    else {
                                      (**(code **)(*local_13d8 + 0x18))(local_13d8,local_13f8);
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              Mat::reshape(in_stack_ffffffffffffe948,iVar4,iVar5,_c,
                                           in_stack_ffffffffffffe930);
                              ppvVar3 = local_cb0;
                              local_c40 = local_cb0;
                              local_c48 = &local_13b0;
                              if (local_cb0 != local_c48) {
                                if (local_13a8 != (int *)0x0) {
                                  local_c4c = 1;
                                  LOCK();
                                  local_c50 = *local_13a8;
                                  *local_13a8 = *local_13a8 + 1;
                                  UNLOCK();
                                }
                                local_2b0 = local_cb0;
                                if (local_cb0[1] != (void *)0x0) {
                                  piVar1 = (int *)local_cb0[1];
                                  local_2b4 = 0xffffffff;
                                  LOCK();
                                  local_2b8 = *piVar1;
                                  *piVar1 = *piVar1 + -1;
                                  UNLOCK();
                                  if (local_2b8 == 1) {
                                    if (local_cb0[4] == (void *)0x0) {
                                      local_278 = *local_cb0;
                                      if (local_278 != (void *)0x0) {
                                        free(local_278);
                                      }
                                    }
                                    else {
                                      (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                                    }
                                  }
                                }
                                *ppvVar3 = (void *)0x0;
                                ppvVar3[2] = (void *)0x0;
                                *(undefined4 *)(ppvVar3 + 3) = 0;
                                *(undefined4 *)(ppvVar3 + 5) = 0;
                                *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                                *(undefined4 *)(ppvVar3 + 6) = 0;
                                *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                                *(undefined4 *)(ppvVar3 + 7) = 0;
                                ppvVar3[8] = (void *)0x0;
                                ppvVar3[1] = (void *)0x0;
                                *ppvVar3 = *local_c48;
                                ppvVar3[1] = local_c48[1];
                                ppvVar3[2] = local_c48[2];
                                *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_c48 + 3);
                                ppvVar3[4] = local_c48[4];
                                *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_c48 + 5);
                                *(undefined4 *)((long)ppvVar3 + 0x2c) =
                                     *(undefined4 *)((long)local_c48 + 0x2c);
                                *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_c48 + 6);
                                *(undefined4 *)((long)ppvVar3 + 0x34) =
                                     *(undefined4 *)((long)local_c48 + 0x34);
                                *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_c48 + 7);
                                ppvVar3[8] = local_c48[8];
                              }
                              local_7c0 = &local_13b0;
                              if (local_13a8 != (int *)0x0) {
                                local_724 = 0xffffffff;
                                LOCK();
                                local_728 = *local_13a8;
                                *local_13a8 = *local_13a8 + -1;
                                UNLOCK();
                                if (local_728 == 1) {
                                  local_720 = local_7c0;
                                  if (local_1390 == (long *)0x0) {
                                    if (local_13b0 != (void *)0x0) {
                                      free(local_13b0);
                                    }
                                  }
                                  else {
                                    (**(code **)(*local_1390 + 0x18))(local_1390,local_13b0);
                                  }
                                }
                              }
                            }
                          }
                          else {
                            Mat::reshape(in_stack_ffffffffffffe948,iVar4,iVar5,_c,
                                         in_stack_ffffffffffffe930);
                            local_c20 = local_cb0;
                            local_c28 = &local_1368;
                            if (local_cb0 != local_c28) {
                              if (local_1360 != (int *)0x0) {
                                local_c2c = 1;
                                LOCK();
                                local_c30 = *local_1360;
                                *local_1360 = *local_1360 + 1;
                                UNLOCK();
                              }
                              local_2c0 = local_cb0;
                              ppvVar3 = local_cb0;
                              ppvVar6 = local_cb0;
                              if (local_cb0[1] != (void *)0x0) {
                                piVar1 = (int *)local_cb0[1];
                                local_2c4 = 0xffffffff;
                                LOCK();
                                local_2c8 = *piVar1;
                                *piVar1 = *piVar1 + -1;
                                UNLOCK();
                                if (local_2c8 == 1) {
                                  if (local_cb0[4] == (void *)0x0) {
                                    local_270 = *local_cb0;
                                    if (local_270 != (void *)0x0) {
                                      free(local_270);
                                    }
                                  }
                                  else {
                                    (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                                  }
                                }
                              }
                              *ppvVar3 = (void *)0x0;
                              ppvVar3[2] = (void *)0x0;
                              *(undefined4 *)(ppvVar3 + 3) = 0;
                              *(undefined4 *)(ppvVar3 + 5) = 0;
                              *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                              *(undefined4 *)(ppvVar3 + 6) = 0;
                              *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                              *(undefined4 *)(ppvVar3 + 7) = 0;
                              ppvVar3[8] = (void *)0x0;
                              ppvVar3[1] = (void *)0x0;
                              *ppvVar6 = *local_c28;
                              ppvVar6[1] = local_c28[1];
                              ppvVar6[2] = local_c28[2];
                              *(undefined4 *)(ppvVar6 + 3) = *(undefined4 *)(local_c28 + 3);
                              ppvVar6[4] = local_c28[4];
                              *(undefined4 *)(ppvVar6 + 5) = *(undefined4 *)(local_c28 + 5);
                              *(undefined4 *)((long)ppvVar6 + 0x2c) =
                                   *(undefined4 *)((long)local_c28 + 0x2c);
                              *(undefined4 *)(ppvVar6 + 6) = *(undefined4 *)(local_c28 + 6);
                              *(undefined4 *)((long)ppvVar6 + 0x34) =
                                   *(undefined4 *)((long)local_c28 + 0x34);
                              *(undefined4 *)(ppvVar6 + 7) = *(undefined4 *)(local_c28 + 7);
                              ppvVar6[8] = local_c28[8];
                            }
                            ppvVar3 = &local_1368;
                            if (local_1360 != (int *)0x0) {
                              local_704 = 0xffffffff;
                              LOCK();
                              local_708 = *local_1360;
                              *local_1360 = *local_1360 + -1;
                              UNLOCK();
                              if (local_708 == 1) {
                                local_7d0 = ppvVar3;
                                local_700 = ppvVar3;
                                if (local_1348 == (long *)0x0) {
                                  if (local_1368 != (void *)0x0) {
                                    free(local_1368);
                                  }
                                }
                                else {
                                  (**(code **)(*local_1348 + 0x18))(local_1348,local_1368);
                                }
                              }
                            }
                            *ppvVar3 = (void *)0x0;
                            ppvVar3[2] = (void *)0x0;
                            *(undefined4 *)(ppvVar3 + 3) = 0;
                            *(undefined4 *)(ppvVar3 + 5) = 0;
                            *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                            *(undefined4 *)(ppvVar3 + 6) = 0;
                            *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                            *(undefined4 *)(ppvVar3 + 7) = 0;
                            ppvVar3[8] = (void *)0x0;
                            ppvVar3[1] = (void *)0x0;
                          }
                        }
                        else {
                          Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,iVar4,
                                       in_stack_ffffffffffffe8b8);
                          ppvVar3 = local_cb0;
                          local_c00 = local_cb0;
                          local_c08 = &local_1320;
                          if (local_cb0 != local_c08) {
                            if (local_1318 != (int *)0x0) {
                              local_c0c = 1;
                              LOCK();
                              local_c10 = *local_1318;
                              *local_1318 = *local_1318 + 1;
                              UNLOCK();
                            }
                            local_2d0 = local_cb0;
                            if (local_cb0[1] != (void *)0x0) {
                              piVar1 = (int *)local_cb0[1];
                              local_2d4 = 0xffffffff;
                              LOCK();
                              local_2d8 = *piVar1;
                              *piVar1 = *piVar1 + -1;
                              UNLOCK();
                              if (local_2d8 == 1) {
                                if (local_cb0[4] == (void *)0x0) {
                                  local_268 = *local_cb0;
                                  if (local_268 != (void *)0x0) {
                                    free(local_268);
                                  }
                                }
                                else {
                                  (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                                }
                              }
                            }
                            *ppvVar3 = (void *)0x0;
                            ppvVar3[2] = (void *)0x0;
                            *(undefined4 *)(ppvVar3 + 3) = 0;
                            *(undefined4 *)(ppvVar3 + 5) = 0;
                            *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                            *(undefined4 *)(ppvVar3 + 6) = 0;
                            *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                            *(undefined4 *)(ppvVar3 + 7) = 0;
                            ppvVar3[8] = (void *)0x0;
                            ppvVar3[1] = (void *)0x0;
                            *ppvVar3 = *local_c08;
                            ppvVar3[1] = local_c08[1];
                            ppvVar3[2] = local_c08[2];
                            *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_c08 + 3);
                            ppvVar3[4] = local_c08[4];
                            *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_c08 + 5);
                            *(undefined4 *)((long)ppvVar3 + 0x2c) =
                                 *(undefined4 *)((long)local_c08 + 0x2c);
                            *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_c08 + 6);
                            *(undefined4 *)((long)ppvVar3 + 0x34) =
                                 *(undefined4 *)((long)local_c08 + 0x34);
                            *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_c08 + 7);
                            ppvVar3[8] = local_c08[8];
                          }
                          local_7e0 = &local_1320;
                          if (local_1318 != (int *)0x0) {
                            local_6e4 = 0xffffffff;
                            LOCK();
                            local_6e8 = *local_1318;
                            *local_1318 = *local_1318 + -1;
                            UNLOCK();
                            if (local_6e8 == 1) {
                              local_6e0 = local_7e0;
                              if (local_1300 == (long *)0x0) {
                                if (local_1320 != (void *)0x0) {
                                  free(local_1320);
                                }
                              }
                              else {
                                (**(code **)(*local_1300 + 0x18))(local_1300,local_1320);
                              }
                            }
                          }
                        }
                      }
                      else {
                        Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,iVar4,in_stack_ffffffffffffe8b8
                                    );
                        ppvVar3 = local_cb0;
                        local_be0 = local_cb0;
                        local_be8 = &local_12d8;
                        if (local_cb0 != local_be8) {
                          if (local_12d0 != (int *)0x0) {
                            local_bec = 1;
                            LOCK();
                            local_bf0 = *local_12d0;
                            *local_12d0 = *local_12d0 + 1;
                            UNLOCK();
                          }
                          local_2e0 = local_cb0;
                          if (local_cb0[1] != (void *)0x0) {
                            piVar1 = (int *)local_cb0[1];
                            local_2e4 = 0xffffffff;
                            LOCK();
                            local_2e8 = *piVar1;
                            *piVar1 = *piVar1 + -1;
                            UNLOCK();
                            if (local_2e8 == 1) {
                              if (local_cb0[4] == (void *)0x0) {
                                local_260 = *local_cb0;
                                if (local_260 != (void *)0x0) {
                                  free(local_260);
                                }
                              }
                              else {
                                (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                              }
                            }
                          }
                          *ppvVar3 = (void *)0x0;
                          ppvVar3[2] = (void *)0x0;
                          *(undefined4 *)(ppvVar3 + 3) = 0;
                          *(undefined4 *)(ppvVar3 + 5) = 0;
                          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                          *(undefined4 *)(ppvVar3 + 6) = 0;
                          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                          *(undefined4 *)(ppvVar3 + 7) = 0;
                          ppvVar3[8] = (void *)0x0;
                          ppvVar3[1] = (void *)0x0;
                          *ppvVar3 = *local_be8;
                          ppvVar3[1] = local_be8[1];
                          ppvVar3[2] = local_be8[2];
                          *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_be8 + 3);
                          ppvVar3[4] = local_be8[4];
                          *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_be8 + 5);
                          *(undefined4 *)((long)ppvVar3 + 0x2c) =
                               *(undefined4 *)((long)local_be8 + 0x2c);
                          *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_be8 + 6);
                          *(undefined4 *)((long)ppvVar3 + 0x34) =
                               *(undefined4 *)((long)local_be8 + 0x34);
                          *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_be8 + 7);
                          ppvVar3[8] = local_be8[8];
                        }
                        local_7f0 = &local_12d8;
                        if (local_12d0 != (int *)0x0) {
                          local_6c4 = 0xffffffff;
                          LOCK();
                          local_6c8 = *local_12d0;
                          *local_12d0 = *local_12d0 + -1;
                          UNLOCK();
                          if (local_6c8 == 1) {
                            local_6c0 = local_7f0;
                            if (local_12b8 == (long *)0x0) {
                              if (local_12d8 != (void *)0x0) {
                                free(local_12d8);
                              }
                            }
                            else {
                              (**(code **)(*local_12b8 + 0x18))(local_12b8,local_12d8);
                            }
                          }
                        }
                      }
                    }
                    else {
                      Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,iVar4,in_stack_ffffffffffffe8b8);
                      ppvVar3 = local_cb0;
                      local_bc0 = local_cb0;
                      local_bc8 = &local_1290;
                      if (local_cb0 != local_bc8) {
                        if (local_1288 != (int *)0x0) {
                          local_bcc = 1;
                          LOCK();
                          local_bd0 = *local_1288;
                          *local_1288 = *local_1288 + 1;
                          UNLOCK();
                        }
                        local_2f0 = local_cb0;
                        if (local_cb0[1] != (void *)0x0) {
                          piVar1 = (int *)local_cb0[1];
                          local_2f4 = 0xffffffff;
                          LOCK();
                          local_2f8 = *piVar1;
                          *piVar1 = *piVar1 + -1;
                          UNLOCK();
                          if (local_2f8 == 1) {
                            if (local_cb0[4] == (void *)0x0) {
                              local_258 = *local_cb0;
                              if (local_258 != (void *)0x0) {
                                free(local_258);
                              }
                            }
                            else {
                              (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                            }
                          }
                        }
                        *ppvVar3 = (void *)0x0;
                        ppvVar3[2] = (void *)0x0;
                        *(undefined4 *)(ppvVar3 + 3) = 0;
                        *(undefined4 *)(ppvVar3 + 5) = 0;
                        *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                        *(undefined4 *)(ppvVar3 + 6) = 0;
                        *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                        *(undefined4 *)(ppvVar3 + 7) = 0;
                        ppvVar3[8] = (void *)0x0;
                        ppvVar3[1] = (void *)0x0;
                        *ppvVar3 = *local_bc8;
                        ppvVar3[1] = local_bc8[1];
                        ppvVar3[2] = local_bc8[2];
                        *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_bc8 + 3);
                        ppvVar3[4] = local_bc8[4];
                        *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_bc8 + 5);
                        *(undefined4 *)((long)ppvVar3 + 0x2c) =
                             *(undefined4 *)((long)local_bc8 + 0x2c);
                        *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_bc8 + 6);
                        *(undefined4 *)((long)ppvVar3 + 0x34) =
                             *(undefined4 *)((long)local_bc8 + 0x34);
                        *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_bc8 + 7);
                        ppvVar3[8] = local_bc8[8];
                      }
                      local_800 = &local_1290;
                      if (local_1288 != (int *)0x0) {
                        local_6a4 = 0xffffffff;
                        LOCK();
                        local_6a8 = *local_1288;
                        *local_1288 = *local_1288 + -1;
                        UNLOCK();
                        if (local_6a8 == 1) {
                          local_6a0 = local_800;
                          if (local_1270 == (long *)0x0) {
                            if (local_1290 != (void *)0x0) {
                              free(local_1290);
                            }
                          }
                          else {
                            (**(code **)(*local_1270 + 0x18))(local_1270,local_1290);
                          }
                        }
                      }
                    }
                  }
                  else {
                    Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,iVar4,in_stack_ffffffffffffe8b8);
                    local_ba0 = local_cb0;
                    local_ba8 = &local_1248;
                    if (local_cb0 != local_ba8) {
                      if (local_1240 != (int *)0x0) {
                        local_bac = 1;
                        LOCK();
                        local_bb0 = *local_1240;
                        *local_1240 = *local_1240 + 1;
                        UNLOCK();
                      }
                      local_300 = local_cb0;
                      ppvVar3 = local_cb0;
                      ppvVar6 = local_cb0;
                      if (local_cb0[1] != (void *)0x0) {
                        piVar1 = (int *)local_cb0[1];
                        local_304 = 0xffffffff;
                        LOCK();
                        local_308 = *piVar1;
                        *piVar1 = *piVar1 + -1;
                        UNLOCK();
                        if (local_308 == 1) {
                          if (local_cb0[4] == (void *)0x0) {
                            local_250 = *local_cb0;
                            if (local_250 != (void *)0x0) {
                              free(local_250);
                            }
                          }
                          else {
                            (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                          }
                        }
                      }
                      *ppvVar3 = (void *)0x0;
                      ppvVar3[2] = (void *)0x0;
                      *(undefined4 *)(ppvVar3 + 3) = 0;
                      *(undefined4 *)(ppvVar3 + 5) = 0;
                      *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                      *(undefined4 *)(ppvVar3 + 6) = 0;
                      *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                      *(undefined4 *)(ppvVar3 + 7) = 0;
                      ppvVar3[8] = (void *)0x0;
                      ppvVar3[1] = (void *)0x0;
                      *ppvVar6 = *local_ba8;
                      ppvVar6[1] = local_ba8[1];
                      ppvVar6[2] = local_ba8[2];
                      *(undefined4 *)(ppvVar6 + 3) = *(undefined4 *)(local_ba8 + 3);
                      ppvVar6[4] = local_ba8[4];
                      *(undefined4 *)(ppvVar6 + 5) = *(undefined4 *)(local_ba8 + 5);
                      *(undefined4 *)((long)ppvVar6 + 0x2c) =
                           *(undefined4 *)((long)local_ba8 + 0x2c);
                      *(undefined4 *)(ppvVar6 + 6) = *(undefined4 *)(local_ba8 + 6);
                      *(undefined4 *)((long)ppvVar6 + 0x34) =
                           *(undefined4 *)((long)local_ba8 + 0x34);
                      *(undefined4 *)(ppvVar6 + 7) = *(undefined4 *)(local_ba8 + 7);
                      ppvVar6[8] = local_ba8[8];
                    }
                    ppvVar3 = &local_1248;
                    if (local_1240 != (int *)0x0) {
                      local_684 = 0xffffffff;
                      LOCK();
                      local_688 = *local_1240;
                      *local_1240 = *local_1240 + -1;
                      UNLOCK();
                      if (local_688 == 1) {
                        local_810 = ppvVar3;
                        local_680 = ppvVar3;
                        if (local_1228 == (long *)0x0) {
                          if (local_1248 != (void *)0x0) {
                            free(local_1248);
                          }
                        }
                        else {
                          (**(code **)(*local_1228 + 0x18))(local_1228,local_1248);
                        }
                      }
                    }
                    *ppvVar3 = (void *)0x0;
                    ppvVar3[2] = (void *)0x0;
                    *(undefined4 *)(ppvVar3 + 3) = 0;
                    *(undefined4 *)(ppvVar3 + 5) = 0;
                    *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                    *(undefined4 *)(ppvVar3 + 6) = 0;
                    *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                    *(undefined4 *)(ppvVar3 + 7) = 0;
                    ppvVar3[8] = (void *)0x0;
                    ppvVar3[1] = (void *)0x0;
                  }
                }
                else {
                  Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,iVar4,in_stack_ffffffffffffe8b8);
                  ppvVar3 = local_cb0;
                  local_b80 = local_cb0;
                  local_b88 = &local_1200;
                  if (local_cb0 != local_b88) {
                    if (local_11f8 != (int *)0x0) {
                      local_b8c = 1;
                      LOCK();
                      local_b90 = *local_11f8;
                      *local_11f8 = *local_11f8 + 1;
                      UNLOCK();
                    }
                    local_310 = local_cb0;
                    if (local_cb0[1] != (void *)0x0) {
                      piVar1 = (int *)local_cb0[1];
                      local_314 = 0xffffffff;
                      LOCK();
                      local_318 = *piVar1;
                      *piVar1 = *piVar1 + -1;
                      UNLOCK();
                      if (local_318 == 1) {
                        if (local_cb0[4] == (void *)0x0) {
                          local_248 = *local_cb0;
                          if (local_248 != (void *)0x0) {
                            free(local_248);
                          }
                        }
                        else {
                          (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                        }
                      }
                    }
                    *ppvVar3 = (void *)0x0;
                    ppvVar3[2] = (void *)0x0;
                    *(undefined4 *)(ppvVar3 + 3) = 0;
                    *(undefined4 *)(ppvVar3 + 5) = 0;
                    *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                    *(undefined4 *)(ppvVar3 + 6) = 0;
                    *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                    *(undefined4 *)(ppvVar3 + 7) = 0;
                    ppvVar3[8] = (void *)0x0;
                    ppvVar3[1] = (void *)0x0;
                    *ppvVar3 = *local_b88;
                    ppvVar3[1] = local_b88[1];
                    ppvVar3[2] = local_b88[2];
                    *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_b88 + 3);
                    ppvVar3[4] = local_b88[4];
                    *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_b88 + 5);
                    *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_b88 + 0x2c);
                    *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_b88 + 6);
                    *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_b88 + 0x34);
                    *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_b88 + 7);
                    ppvVar3[8] = local_b88[8];
                  }
                  local_820 = &local_1200;
                  if (local_11f8 != (int *)0x0) {
                    local_664 = 0xffffffff;
                    LOCK();
                    local_668 = *local_11f8;
                    *local_11f8 = *local_11f8 + -1;
                    UNLOCK();
                    if (local_668 == 1) {
                      local_660 = local_820;
                      if (local_11e0 == (long *)0x0) {
                        if (local_1200 != (void *)0x0) {
                          free(local_1200);
                        }
                      }
                      else {
                        (**(code **)(*local_11e0 + 0x18))(local_11e0,local_1200);
                      }
                    }
                  }
                }
              }
              else {
                Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,iVar4,in_stack_ffffffffffffe8b8);
                ppvVar3 = local_cb0;
                local_b60 = local_cb0;
                local_b68 = &local_11b8;
                if (local_cb0 != local_b68) {
                  if (local_11b0 != (int *)0x0) {
                    local_b6c = 1;
                    LOCK();
                    local_b70 = *local_11b0;
                    *local_11b0 = *local_11b0 + 1;
                    UNLOCK();
                  }
                  local_320 = local_cb0;
                  if (local_cb0[1] != (void *)0x0) {
                    piVar1 = (int *)local_cb0[1];
                    local_324 = 0xffffffff;
                    LOCK();
                    local_328 = *piVar1;
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (local_328 == 1) {
                      if (local_cb0[4] == (void *)0x0) {
                        local_240 = *local_cb0;
                        if (local_240 != (void *)0x0) {
                          free(local_240);
                        }
                      }
                      else {
                        (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                      }
                    }
                  }
                  *ppvVar3 = (void *)0x0;
                  ppvVar3[2] = (void *)0x0;
                  *(undefined4 *)(ppvVar3 + 3) = 0;
                  *(undefined4 *)(ppvVar3 + 5) = 0;
                  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                  *(undefined4 *)(ppvVar3 + 6) = 0;
                  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                  *(undefined4 *)(ppvVar3 + 7) = 0;
                  ppvVar3[8] = (void *)0x0;
                  ppvVar3[1] = (void *)0x0;
                  *ppvVar3 = *local_b68;
                  ppvVar3[1] = local_b68[1];
                  ppvVar3[2] = local_b68[2];
                  *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_b68 + 3);
                  ppvVar3[4] = local_b68[4];
                  *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_b68 + 5);
                  *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_b68 + 0x2c);
                  *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_b68 + 6);
                  *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_b68 + 0x34);
                  *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_b68 + 7);
                  ppvVar3[8] = local_b68[8];
                }
                local_830 = &local_11b8;
                if (local_11b0 != (int *)0x0) {
                  local_644 = 0xffffffff;
                  LOCK();
                  local_648 = *local_11b0;
                  *local_11b0 = *local_11b0 + -1;
                  UNLOCK();
                  if (local_648 == 1) {
                    local_640 = local_830;
                    if (local_1198 == (long *)0x0) {
                      if (local_11b8 != (void *)0x0) {
                        free(local_11b8);
                      }
                    }
                    else {
                      (**(code **)(*local_1198 + 0x18))(local_1198,local_11b8);
                    }
                  }
                }
              }
            }
            else {
              Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,in_stack_ffffffffffffe8b8);
              ppvVar3 = local_cb0;
              local_b40 = local_cb0;
              local_b48 = &local_1170;
              if (local_cb0 != local_b48) {
                if (local_1168 != (int *)0x0) {
                  local_b4c = 1;
                  LOCK();
                  local_b50 = *local_1168;
                  *local_1168 = *local_1168 + 1;
                  UNLOCK();
                }
                local_330 = local_cb0;
                if (local_cb0[1] != (void *)0x0) {
                  piVar1 = (int *)local_cb0[1];
                  local_334 = 0xffffffff;
                  LOCK();
                  local_338 = *piVar1;
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (local_338 == 1) {
                    if (local_cb0[4] == (void *)0x0) {
                      local_238 = *local_cb0;
                      if (local_238 != (void *)0x0) {
                        free(local_238);
                      }
                    }
                    else {
                      (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                    }
                  }
                }
                *ppvVar3 = (void *)0x0;
                ppvVar3[2] = (void *)0x0;
                *(undefined4 *)(ppvVar3 + 3) = 0;
                *(undefined4 *)(ppvVar3 + 5) = 0;
                *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                *(undefined4 *)(ppvVar3 + 6) = 0;
                *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                *(undefined4 *)(ppvVar3 + 7) = 0;
                ppvVar3[8] = (void *)0x0;
                ppvVar3[1] = (void *)0x0;
                *ppvVar3 = *local_b48;
                ppvVar3[1] = local_b48[1];
                ppvVar3[2] = local_b48[2];
                *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_b48 + 3);
                ppvVar3[4] = local_b48[4];
                *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_b48 + 5);
                *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_b48 + 0x2c);
                *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_b48 + 6);
                *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_b48 + 0x34);
                *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_b48 + 7);
                ppvVar3[8] = local_b48[8];
              }
              local_840 = &local_1170;
              if (local_1168 != (int *)0x0) {
                local_624 = 0xffffffff;
                LOCK();
                local_628 = *local_1168;
                *local_1168 = *local_1168 + -1;
                UNLOCK();
                if (local_628 == 1) {
                  local_620 = local_840;
                  if (local_1150 == (long *)0x0) {
                    if (local_1170 != (void *)0x0) {
                      free(local_1170);
                    }
                  }
                  else {
                    (**(code **)(*local_1150 + 0x18))(local_1150,local_1170);
                  }
                }
              }
            }
          }
          else {
            Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,in_stack_ffffffffffffe8b8);
            ppvVar3 = local_cb0;
            local_b20 = local_cb0;
            local_b28 = &local_1128;
            if (local_cb0 != local_b28) {
              if (local_1120 != (int *)0x0) {
                local_b2c = 1;
                LOCK();
                local_b30 = *local_1120;
                *local_1120 = *local_1120 + 1;
                UNLOCK();
              }
              local_340 = local_cb0;
              if (local_cb0[1] != (void *)0x0) {
                piVar1 = (int *)local_cb0[1];
                local_344 = 0xffffffff;
                LOCK();
                local_348 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (local_348 == 1) {
                  if (local_cb0[4] == (void *)0x0) {
                    local_230 = *local_cb0;
                    if (local_230 != (void *)0x0) {
                      free(local_230);
                    }
                  }
                  else {
                    (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                  }
                }
              }
              *ppvVar3 = (void *)0x0;
              ppvVar3[2] = (void *)0x0;
              *(undefined4 *)(ppvVar3 + 3) = 0;
              *(undefined4 *)(ppvVar3 + 5) = 0;
              *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
              *(undefined4 *)(ppvVar3 + 6) = 0;
              *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
              *(undefined4 *)(ppvVar3 + 7) = 0;
              ppvVar3[8] = (void *)0x0;
              ppvVar3[1] = (void *)0x0;
              *ppvVar3 = *local_b28;
              ppvVar3[1] = local_b28[1];
              ppvVar3[2] = local_b28[2];
              *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_b28 + 3);
              ppvVar3[4] = local_b28[4];
              *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_b28 + 5);
              *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_b28 + 0x2c);
              *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_b28 + 6);
              *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_b28 + 0x34);
              *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_b28 + 7);
              ppvVar3[8] = local_b28[8];
            }
            local_850 = &local_1128;
            if (local_1120 != (int *)0x0) {
              local_604 = 0xffffffff;
              LOCK();
              local_608 = *local_1120;
              *local_1120 = *local_1120 + -1;
              UNLOCK();
              if (local_608 == 1) {
                local_600 = local_850;
                if (local_1108 == (long *)0x0) {
                  if (local_1128 != (void *)0x0) {
                    free(local_1128);
                  }
                }
                else {
                  (**(code **)(*local_1108 + 0x18))(local_1108,local_1128);
                }
              }
            }
          }
        }
        else {
          Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,in_stack_ffffffffffffe8b8);
          ppvVar3 = local_cb0;
          local_b00 = local_cb0;
          local_b08 = &local_10e0;
          if (local_cb0 != local_b08) {
            if (local_10d8 != (int *)0x0) {
              local_b0c = 1;
              LOCK();
              local_b10 = *local_10d8;
              *local_10d8 = *local_10d8 + 1;
              UNLOCK();
            }
            local_350 = local_cb0;
            if (local_cb0[1] != (void *)0x0) {
              piVar1 = (int *)local_cb0[1];
              local_354 = 0xffffffff;
              LOCK();
              local_358 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_358 == 1) {
                if (local_cb0[4] == (void *)0x0) {
                  local_228 = *local_cb0;
                  if (local_228 != (void *)0x0) {
                    free(local_228);
                  }
                }
                else {
                  (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            ppvVar3[2] = (void *)0x0;
            *(undefined4 *)(ppvVar3 + 3) = 0;
            *(undefined4 *)(ppvVar3 + 5) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
            *(undefined4 *)(ppvVar3 + 6) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
            *(undefined4 *)(ppvVar3 + 7) = 0;
            ppvVar3[8] = (void *)0x0;
            ppvVar3[1] = (void *)0x0;
            *ppvVar3 = *local_b08;
            ppvVar3[1] = local_b08[1];
            ppvVar3[2] = local_b08[2];
            *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_b08 + 3);
            ppvVar3[4] = local_b08[4];
            *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_b08 + 5);
            *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_b08 + 0x2c);
            *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_b08 + 6);
            *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_b08 + 0x34);
            *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_b08 + 7);
            ppvVar3[8] = local_b08[8];
          }
          local_860 = &local_10e0;
          if (local_10d8 != (int *)0x0) {
            local_5e4 = 0xffffffff;
            LOCK();
            local_5e8 = *local_10d8;
            *local_10d8 = *local_10d8 + -1;
            UNLOCK();
            if (local_5e8 == 1) {
              local_5e0 = local_860;
              if (local_10c0 == (long *)0x0) {
                if (local_10e0 != (void *)0x0) {
                  free(local_10e0);
                }
              }
              else {
                (**(code **)(*local_10c0 + 0x18))(local_10c0,local_10e0);
              }
            }
          }
        }
      }
      else {
        Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,in_stack_ffffffffffffe8b8);
        ppvVar3 = local_cb0;
        local_ae0 = local_cb0;
        local_ae8 = &local_1098;
        if (local_cb0 != local_ae8) {
          if (local_1090 != (int *)0x0) {
            local_aec = 1;
            LOCK();
            local_af0 = *local_1090;
            *local_1090 = *local_1090 + 1;
            UNLOCK();
          }
          local_360 = local_cb0;
          if (local_cb0[1] != (void *)0x0) {
            piVar1 = (int *)local_cb0[1];
            local_364 = 0xffffffff;
            LOCK();
            local_368 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_368 == 1) {
              if (local_cb0[4] == (void *)0x0) {
                local_220 = *local_cb0;
                if (local_220 != (void *)0x0) {
                  free(local_220);
                }
              }
              else {
                (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          ppvVar3[2] = (void *)0x0;
          *(undefined4 *)(ppvVar3 + 3) = 0;
          *(undefined4 *)(ppvVar3 + 5) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
          *(undefined4 *)(ppvVar3 + 6) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
          *(undefined4 *)(ppvVar3 + 7) = 0;
          ppvVar3[8] = (void *)0x0;
          ppvVar3[1] = (void *)0x0;
          *ppvVar3 = *local_ae8;
          ppvVar3[1] = local_ae8[1];
          ppvVar3[2] = local_ae8[2];
          *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_ae8 + 3);
          ppvVar3[4] = local_ae8[4];
          *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_ae8 + 5);
          *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_ae8 + 0x2c);
          *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_ae8 + 6);
          *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_ae8 + 0x34);
          *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_ae8 + 7);
          ppvVar3[8] = local_ae8[8];
        }
        local_870 = &local_1098;
        if (local_1090 != (int *)0x0) {
          local_5c4 = 0xffffffff;
          LOCK();
          local_5c8 = *local_1090;
          *local_1090 = *local_1090 + -1;
          UNLOCK();
          if (local_5c8 == 1) {
            local_5c0 = local_870;
            if (local_1078 == (long *)0x0) {
              if (local_1098 != (void *)0x0) {
                free(local_1098);
              }
            }
            else {
              (**(code **)(*local_1078 + 0x18))(local_1078,local_1098);
            }
          }
        }
      }
    }
    else {
      Mat::reshape(in_stack_ffffffffffffe8c8,iVar5,in_stack_ffffffffffffe8b8);
      ppvVar3 = local_cb0;
      local_ac0 = local_cb0;
      local_ac8 = &local_1050;
      if (local_cb0 != local_ac8) {
        if (local_1048 != (int *)0x0) {
          local_acc = 1;
          LOCK();
          local_ad0 = *local_1048;
          *local_1048 = *local_1048 + 1;
          UNLOCK();
        }
        local_370 = local_cb0;
        if (local_cb0[1] != (void *)0x0) {
          piVar1 = (int *)local_cb0[1];
          local_374 = 0xffffffff;
          LOCK();
          local_378 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_378 == 1) {
            if (local_cb0[4] == (void *)0x0) {
              local_218 = *local_cb0;
              if (local_218 != (void *)0x0) {
                free(local_218);
              }
            }
            else {
              (**(code **)(*local_cb0[4] + 0x18))(local_cb0[4],*local_cb0);
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        ppvVar3[2] = (void *)0x0;
        *(undefined4 *)(ppvVar3 + 3) = 0;
        *(undefined4 *)(ppvVar3 + 5) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
        *(undefined4 *)(ppvVar3 + 6) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
        *(undefined4 *)(ppvVar3 + 7) = 0;
        ppvVar3[8] = (void *)0x0;
        ppvVar3[1] = (void *)0x0;
        *ppvVar3 = *local_ac8;
        ppvVar3[1] = local_ac8[1];
        ppvVar3[2] = local_ac8[2];
        *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_ac8 + 3);
        ppvVar3[4] = local_ac8[4];
        *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_ac8 + 5);
        *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_ac8 + 0x2c);
        *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_ac8 + 6);
        *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_ac8 + 0x34);
        *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_ac8 + 7);
        ppvVar3[8] = local_ac8[8];
      }
      local_880 = &local_1050;
      if (local_1048 != (int *)0x0) {
        local_5a4 = 0xffffffff;
        LOCK();
        local_5a8 = *local_1048;
        *local_1048 = *local_1048 + -1;
        UNLOCK();
        if (local_5a8 == 1) {
          local_5a0 = local_880;
          if (local_1030 == (long *)0x0) {
            if (local_1050 != (void *)0x0) {
              free(local_1050);
            }
          }
          else {
            (**(code **)(*local_1030 + 0x18))(local_1030,local_1050);
          }
        }
      }
    }
  }
  bVar2 = true;
  if (*local_cb0 != (void *)0x0) {
    bVar2 = (long)local_cb0[8] * (long)*(int *)(local_cb0 + 7) == 0;
  }
  if (bVar2) {
    local_c94 = -100;
  }
  else {
    local_c94 = 0;
  }
  return local_c94;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_d = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_d = d == 1 && squeeze_d;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;

            if (dims == 1 && axis == 0)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 0)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 4 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 4 && axis == 1)
            {
                _squeeze_d = d == 1;
            }
            if (dims == 4 && axis == 2)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 4 && axis == 3)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (dims == 4)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h && _squeeze_d)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(d, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(d, channels, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_d)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_d)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, d, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, d, opt.blob_allocator);
        }
        else if (_squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, d, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, d, channels, opt.blob_allocator);
        }
        else if (_squeeze_d)
        {
            top_blob = bottom_blob.reshape(w, h, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, d, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}